

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fld_current.c
# Opt level: O0

int set_current_field(FORM *form,FIELD *field)

{
  _Bool _Var1;
  int *piVar2;
  int local_24;
  int err;
  FIELD *field_local;
  FORM *form_local;
  
  local_24 = 0;
  if ((form == (FORM *)0x0) || (field == (FIELD *)0x0)) {
    piVar2 = __errno_location();
    *piVar2 = -2;
    form_local._4_4_ = -2;
  }
  else if ((form == field->form) && ((field->opts & 3U) == 3)) {
    if ((form->status & 1) == 0) {
      form->current = field;
      form->curpage = field->page;
    }
    else if ((form->status & 2) == 0) {
      if (form->current != field) {
        _Var1 = _nc_Internal_Validation(form);
        if (_Var1) {
          if ((form != (FORM *)0x0) && (form->fieldterm != (_func_void_formnode_ptr *)0x0)) {
            form->status = form->status | 2;
            (*form->fieldterm)(form);
            form->status = form->status & 0xfffd;
          }
          if (field->page == form->curpage) {
            local_24 = _nc_Set_Current_Field(form,field);
          }
          else {
            if ((form != (FORM *)0x0) && (form->formterm != (_func_void_formnode_ptr *)0x0)) {
              form->status = form->status | 2;
              (*form->formterm)(form);
              form->status = form->status & 0xfffd;
            }
            local_24 = _nc_Set_Form_Page(form,(int)field->page,field);
            if ((form != (FORM *)0x0) && (form->forminit != (_func_void_formnode_ptr *)0x0)) {
              form->status = form->status | 2;
              (*form->forminit)(form);
              form->status = form->status & 0xfffd;
            }
          }
          if ((form != (FORM *)0x0) && (form->fieldinit != (_func_void_formnode_ptr *)0x0)) {
            form->status = form->status | 2;
            (*form->fieldinit)(form);
            form->status = form->status & 0xfffd;
          }
          _nc_Refresh_Current_Field(form);
        }
        else {
          local_24 = -0xd;
        }
      }
    }
    else {
      local_24 = -5;
    }
    piVar2 = __errno_location();
    *piVar2 = local_24;
    form_local._4_4_ = local_24;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = -0xc;
    form_local._4_4_ = -0xc;
  }
  return form_local._4_4_;
}

Assistant:

int set_current_field(FORM  * form, FIELD * field)
{
  int err = E_OK;

  if ( !form || !field )
    RETURN(E_BAD_ARGUMENT);

  if ( (form != field->form) || Field_Is_Not_Selectable(field) )
    RETURN(E_REQUEST_DENIED);

  if (!(form->status & _POSTED))
    {
      form->current = field;
      form->curpage = field->page;
  }
  else
    {
      if (form->status & _IN_DRIVER) 
	err = E_BAD_STATE;
      else
	{
	  if (form->current != field)
	    {
	      if (!_nc_Internal_Validation(form)) 
	       err = E_INVALID_FIELD;
	      else
		{
		  Call_Hook(form,fieldterm);
		  if (field->page != form->curpage)
		    {
		      Call_Hook(form,formterm);
		      err = _nc_Set_Form_Page(form,field->page,field);
		      Call_Hook(form,forminit);
		    } 
		  else 
		    {
		      err = _nc_Set_Current_Field(form,field);
		    }
		  Call_Hook(form,fieldinit);
		  _nc_Refresh_Current_Field(form);
		}
	    }
	}
    }
  RETURN(err);
}